

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

OPEN_HANDLE open_clone(OPEN_HANDLE value)

{
  AMQP_VALUE pAVar1;
  OPEN_HANDLE local_18;
  OPEN_INSTANCE *open_instance;
  OPEN_HANDLE value_local;
  
  local_18 = (OPEN_HANDLE)malloc(8);
  if (local_18 != (OPEN_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (OPEN_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

OPEN_HANDLE open_clone(OPEN_HANDLE value)
{
    OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)malloc(sizeof(OPEN_INSTANCE));
    if (open_instance != NULL)
    {
        open_instance->composite_value = amqpvalue_clone(((OPEN_INSTANCE*)value)->composite_value);
        if (open_instance->composite_value == NULL)
        {
            free(open_instance);
            open_instance = NULL;
        }
    }

    return open_instance;
}